

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParser.cpp
# Opt level: O3

void __thiscall AutoArgParse::FlagStore::printUsageSummary(FlagStore *this,ostream *os)

{
  pointer puVar1;
  _Elt_pointer pbVar2;
  char cVar3;
  ArgBase *pAVar4;
  const_iterator cVar5;
  long *plVar6;
  _Map_pointer ppbVar7;
  unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_> *argPtr;
  pointer puVar8;
  _Elt_pointer pbVar9;
  _Elt_pointer __k;
  
  puVar1 = (this->args).
           super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (this->args).
                super__Vector_base<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>,_std::allocator<std::unique_ptr<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    pAVar4 = (puVar8->_M_t).
             super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
             .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
    if ((pAVar4->super_ParseToken).policy == OPTIONAL) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
      pAVar4 = (puVar8->_M_t).
               super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
               .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(pAVar4->name)._M_dataplus._M_p,(pAVar4->name)._M_string_length);
    if ((((puVar8->_M_t).
          super___uniq_ptr_impl<AutoArgParse::ArgBase,_std::default_delete<AutoArgParse::ArgBase>_>.
          _M_t.
          super__Tuple_impl<0UL,_AutoArgParse::ArgBase_*,_std::default_delete<AutoArgParse::ArgBase>_>
          .super__Head_base<0UL,_AutoArgParse::ArgBase_*,_false>._M_head_impl)->super_ParseToken).
        policy == OPTIONAL) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
    }
  }
  __k = (this->flagInsertionOrder).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pbVar2 = (this->flagInsertionOrder).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (__k != pbVar2) {
    pbVar9 = (this->flagInsertionOrder).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar7 = (this->flagInsertionOrder).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      cVar5 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->flags)._M_h,__k);
      if (cVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
      }
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      plVar6 = *(long **)((long)cVar5.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                ._M_cur + 0x28);
      if (*(int *)((long)plVar6 + 0xc) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
        plVar6 = *(long **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                  ._M_cur + 0x28);
      }
      cVar3 = (**(code **)(*plVar6 + 0x28))();
      if (cVar3 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(__k->_M_dataplus)._M_p,__k->_M_string_length);
      }
      (**(code **)(**(long **)((long)cVar5.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                     ._M_cur + 0x28) + 0x20))
                (*(long **)((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                  ._M_cur + 0x28),os);
      if (*(int *)(*(long *)((long)cVar5.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<AutoArgParse::FlagBase,_std::default_delete<AutoArgParse::FlagBase>_>_>,_true>
                                   ._M_cur + 0x28) + 0xc) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
      }
      __k = __k + 1;
      if (__k == pbVar9) {
        __k = ppbVar7[1];
        ppbVar7 = ppbVar7 + 1;
        pbVar9 = __k + 0x10;
      }
    } while (__k != pbVar2);
  }
  return;
}

Assistant:

AUTOARGPARSE_INLINE void FlagStore::printUsageSummary(std::ostream& os) const {
    for (auto& argPtr : args) {
        os << " ";
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "[";
        }
        os << argPtr->name;
        if (argPtr->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
    for (const auto& flag : flagInsertionOrder) {
        auto& flagObj = flags.at(flag);
        os << " ";

        if (flagObj->policy == Policy::OPTIONAL) {
            os << "[";
        }
        if (!flagObj->isExclusiveGroup()) {
            os << flag;
        }
        flagObj->printUsageSummary(os);
        if (flagObj->policy == Policy::OPTIONAL) {
            os << "]";
        }
    }
}